

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::HttpServer::Connection::~Connection(Connection *this)

{
  uint *puVar1;
  HttpServer *pHVar2;
  PromiseFulfiller<void> *pPVar3;
  Disposer *pDVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
  aVar5;
  PromiseArenaMember *node;
  Iface *pIVar6;
  undefined1 local_19;
  
  pHVar2 = this->server;
  puVar1 = &pHVar2->connectionCount;
  *puVar1 = *puVar1 - 1;
  if ((*puVar1 == 0) &&
     ((pHVar2->zeroConnectionsFulfiller).ptr.ptr != (PromiseFulfiller<void> *)0x0)) {
    pPVar3 = (pHVar2->zeroConnectionsFulfiller).ptr.ptr;
    (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar3,&local_19);
  }
  pPVar3 = (this->tunnelWriteGuard).ptr.ptr;
  if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
    (this->tunnelWriteGuard).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar4 = (this->tunnelWriteGuard).ptr.disposer;
    (**pDVar4->_vptr_Disposer)
              (pDVar4,(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar3->super_PromiseRejector)._vptr_PromiseRejector);
  }
  if (((this->tunnelRejected).ptr.isSet == true) &&
     (aVar5 = (this->tunnelRejected).ptr.field_1,
     aVar5 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
               )0x0)) {
    (this->tunnelRejected).ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
          )0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar5);
  }
  if (((this->webSocketError).ptr.isSet == true) &&
     (aVar5 = (this->webSocketError).ptr.field_1,
     aVar5 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
               )0x0)) {
    (this->webSocketError).ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
          )0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar5);
  }
  if ((this->currentMethod).ptr.isSet == true) {
    if ((this->currentMethod).ptr.field_1.value.tag == 1) {
      (this->currentMethod).ptr.field_1.value.tag = 0;
    }
    if ((this->currentMethod).ptr.field_1.value.tag == 2) {
      (this->currentMethod).ptr.field_1.value.tag = 0;
    }
  }
  node = &((this->httpOutput).writeQueue.super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->httpOutput).writeQueue.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::
  ~WrappableStreamMixin
            (&(this->httpOutput).
              super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>);
  anon_unknown_36::HttpInputStreamImpl::~HttpInputStreamImpl(&this->httpInput);
  pIVar6 = (this->factory).impl.ptr;
  if (pIVar6 != (Iface *)0x0) {
    (this->factory).impl.ptr = (Iface *)0x0;
    pDVar4 = (this->factory).impl.disposer;
    (**pDVar4->_vptr_Disposer)(pDVar4,pIVar6->_vptr_Iface[-2] + (long)&pIVar6->_vptr_Iface);
  }
  return;
}

Assistant:

~Connection() noexcept(false) {
    if (--server.connectionCount == 0) {
      KJ_IF_SOME(f, server.zeroConnectionsFulfiller) {
        f->fulfill();
      }
    }
  }